

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<std::__cxx11::list<int,std::allocator<int>>>::
resolve<std::__cxx11::list<int,std::allocator<int>>>
          (PromiseData<std::__cxx11::list<int,std::allocator<int>>> *this,
          list<int,_std::allocator<int>_> *value)

{
  __shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_shared<std::__cxx11::list<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>>
            ((list<int,_std::allocator<int>_> *)&local_20);
  std::__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             *)(this + 0x58),&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
  ::setSettled((PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
                *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }